

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall
S2Builder::MaybeAddExtraSites
          (S2Builder *this,InputEdgeId edge_id,InputEdgeId max_edge_id,
          vector<int,_std::allocator<int>_> *chain,MutableS2ShapeIndex *input_edge_index,
          vector<int,_std::allocator<int>_> *snap_queue)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  BasicVector<Vector3,_double,_3UL> *this_00;
  ostream *poVar9;
  S2LogMessage local_160;
  S2LogMessageVoidify local_149;
  undefined1 local_148 [8];
  S2Point new_site_1;
  S2Point *v1_1;
  S2Point *v0_1;
  S2Point *site_to_avoid;
  S2Point new_site;
  S2Point local_e0;
  D local_c8;
  undefined1 local_b0 [8];
  S2Point mid;
  S2Point *a1;
  S2Point *a0;
  InputEdge *edge;
  S1ChordAngle local_70;
  reference local_68;
  S2Point *v1;
  S2Point *v0;
  iterator pvStack_50;
  SiteId id;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  vector<int,_std::allocator<int>_> *pvStack_30;
  int i;
  vector<int,_std::allocator<int>_> *snap_queue_local;
  MutableS2ShapeIndex *input_edge_index_local;
  vector<int,_std::allocator<int>_> *chain_local;
  InputEdgeId max_edge_id_local;
  InputEdgeId edge_id_local;
  S2Builder *this_local;
  
  __range1._4_4_ = 0;
  pvStack_30 = snap_queue;
  snap_queue_local = (vector<int,_std::allocator<int>_> *)input_edge_index;
  input_edge_index_local = (MutableS2ShapeIndex *)chain;
  chain_local._0_4_ = max_edge_id;
  chain_local._4_4_ = edge_id;
  _max_edge_id_local = this;
  __begin1 = (iterator)
             std::
             vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
             ::operator[](&this->edge_sites_,(long)edge_id);
  __end1 = gtl::compact_array_base<int,_std::allocator<int>_>::begin
                     ((compact_array_base<int,_std::allocator<int>_> *)__begin1);
  pvStack_50 = gtl::compact_array_base<int,_std::allocator<int>_>::end
                         ((compact_array_base<int,_std::allocator<int>_> *)__begin1);
  do {
    if (__end1 == pvStack_50) {
      return;
    }
    iVar2 = *__end1;
    v0._4_4_ = iVar2;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)input_edge_index_local,
                        (long)__range1._4_4_);
    if (iVar2 == *pvVar3) {
      __range1._4_4_ = __range1._4_4_ + 1;
      sVar4 = (size_type)__range1._4_4_;
      sVar5 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)input_edge_index_local);
      if (sVar4 == sVar5) {
        return;
      }
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)input_edge_index_local,
                          (long)(__range1._4_4_ + -1));
      v1 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                     (&this->sites_,(long)*pvVar3);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)input_edge_index_local,
                          (long)__range1._4_4_);
      local_68 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                           (&this->sites_,(long)*pvVar3);
      S1ChordAngle::S1ChordAngle(&local_70,v1,local_68);
      bVar1 = ::operator<(local_70,(S1ChordAngle)(this->min_edge_length_to_split_ca_).length2_);
      if (!bVar1) {
        pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (&this->input_edges_,(long)chain_local._4_4_);
        pvVar7 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                           (&this->input_vertices_,(long)pvVar6->first);
        pvVar8 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                           (&this->input_vertices_,(long)pvVar6->second);
        mid.c_[2] = (this->max_edge_deviation_).radians_;
        bVar1 = S2::IsEdgeBNearEdgeA(pvVar7,pvVar8,v1,local_68,(S1Angle)mid.c_[2]);
        if (!bVar1) {
          S2::Project(&local_e0,v1,pvVar7,pvVar8);
          S2::Project((S2Point *)(new_site.c_ + 2),local_68,pvVar7,pvVar8);
          util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
                    (&local_c8,(BasicVector<Vector3,_double,_3UL> *)&local_e0,(D *)(new_site.c_ + 2)
                    );
          util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
                    ((D *)local_b0,(BasicVector<Vector3,_double,_3UL> *)&local_c8);
          GetSeparationSite((S2Point *)&site_to_avoid,this,(S2Point *)local_b0,v1,local_68,
                            chain_local._4_4_);
          AddExtraSite(this,(S2Point *)&site_to_avoid,(InputEdgeId)chain_local,
                       (MutableS2ShapeIndex *)snap_queue_local,pvStack_30);
          return;
        }
      }
    }
    else if ((0 < __range1._4_4_) && (this->num_forced_sites_ <= v0._4_4_)) {
      this_00 = (BasicVector<Vector3,_double,_3UL> *)
                std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                          (&this->sites_,(long)v0._4_4_);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)input_edge_index_local,
                          (long)(__range1._4_4_ + -1));
      pvVar7 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                         (&this->sites_,(long)*pvVar3);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)input_edge_index_local,
                          (long)__range1._4_4_);
      pvVar8 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                         (&this->sites_,(long)*pvVar3);
      new_site_1.c_[2] = (this->min_edge_site_separation_ca_).length2_;
      iVar2 = s2pred::CompareEdgeDistance
                        ((S2Point *)this_00,pvVar7,pvVar8,(S1ChordAngle)new_site_1.c_[2]);
      if (iVar2 < 0) {
        GetSeparationSite((S2Point *)local_148,this,(S2Point *)this_00,pvVar7,pvVar8,
                          chain_local._4_4_);
        bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                          (this_00,(D *)local_148);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          AddExtraSite(this,(S2Point *)local_148,(InputEdgeId)chain_local,
                       (MutableS2ShapeIndex *)snap_queue_local,pvStack_30);
          return;
        }
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_160,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                   ,0x351,kFatal,(ostream *)&std::cerr);
        poVar9 = S2LogMessage::stream(&local_160);
        poVar9 = std::operator<<(poVar9,"Check failed: (site_to_avoid) != (new_site) ");
        S2LogMessageVoidify::operator&(&local_149,poVar9);
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_160);
      }
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

void S2Builder::MaybeAddExtraSites(InputEdgeId edge_id,
                                   InputEdgeId max_edge_id,
                                   const vector<SiteId>& chain,
                                   const MutableS2ShapeIndex& input_edge_index,
                                   vector<InputEdgeId>* snap_queue) {
  // The snapped chain is always a *subsequence* of the nearby sites
  // (edge_sites_), so we walk through the two arrays in parallel looking for
  // sites that weren't snapped.  We also keep track of the current snapped
  // edge, since it is the only edge that can be too close.
  int i = 0;
  for (SiteId id : edge_sites_[edge_id]) {
    if (id == chain[i]) {
      if (++i == chain.size()) break;
      // Check whether this snapped edge deviates too far from its original
      // position.  If so, we split the edge by adding an extra site.
      const S2Point& v0 = sites_[chain[i - 1]];
      const S2Point& v1 = sites_[chain[i]];
      if (S1ChordAngle(v0, v1) < min_edge_length_to_split_ca_) continue;

      const InputEdge& edge = input_edges_[edge_id];
      const S2Point& a0 = input_vertices_[edge.first];
      const S2Point& a1 = input_vertices_[edge.second];
      if (!S2::IsEdgeBNearEdgeA(a0, a1, v0, v1, max_edge_deviation_)) {
        // Add a new site on the input edge, positioned so that it splits the
        // snapped edge into two approximately equal pieces.  Then we find all
        // the edges near the new site (including this one) and add them to
        // the snap queue.
        //
        // Note that with large snap radii, it is possible that the snapped
        // edge wraps around the sphere the "wrong way".  To handle this we
        // find the preferred split location by projecting both endpoints onto
        // the input edge and taking their midpoint.
        S2Point mid = (S2::Project(v0, a0, a1) +
                       S2::Project(v1, a0, a1)).Normalize();
        S2Point new_site = GetSeparationSite(mid, v0, v1, edge_id);
        AddExtraSite(new_site, max_edge_id, input_edge_index, snap_queue);
        return;
      }
    } else if (i > 0 && id >= num_forced_sites_) {
      // Check whether this "site to avoid" is closer to the snapped edge than
      // min_edge_vertex_separation().  Note that this is the only edge of the
      // chain that can be too close because its vertices must span the point
      // where "site_to_avoid" projects onto the input edge XY (this claim
      // relies on the fact that all sites are separated by at least the snap
      // radius).  We don't try to avoid sites added using ForceVertex()
      // because we don't guarantee any minimum separation from such sites.
      const S2Point& site_to_avoid = sites_[id];
      const S2Point& v0 = sites_[chain[i - 1]];
      const S2Point& v1 = sites_[chain[i]];
      if (s2pred::CompareEdgeDistance(
              site_to_avoid, v0, v1, min_edge_site_separation_ca_) < 0) {
        // A snapped edge can only approach a site too closely when there are
        // no sites near the input edge near that point.  We fix that by
        // adding a new site along the input edge (a "separation site"), then
        // we find all the edges near the new site (including this one) and
        // add them to the snap queue.
        S2Point new_site = GetSeparationSite(site_to_avoid, v0, v1, edge_id);
        S2_DCHECK_NE(site_to_avoid, new_site);
        AddExtraSite(new_site, max_edge_id, input_edge_index, snap_queue);
        return;
      }
    }
  }
}